

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O3

bool __thiscall glu::ES2ContextInfo::isFragmentUniformLoopSupported(ES2ContextInfo *this)

{
  byte bVar1;
  
  if ((this->m_fragmentUniformLoopsSupported).m_isComputed == true) {
    bVar1 = (this->m_fragmentUniformLoopsSupported).m_value;
  }
  else {
    bVar1 = TryCompileProgram::operator()
                      (&(this->m_fragmentUniformLoopsSupported).m_compute,
                       (this->super_ContextInfo).m_context);
    (this->m_fragmentUniformLoopsSupported).m_value = (bool)bVar1;
    (this->m_fragmentUniformLoopsSupported).m_isComputed = true;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool								isFragmentUniformLoopSupported		(void) const	{ return m_fragmentUniformLoopsSupported.getValue(m_context);	}